

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O3

Error asmjit::v1_14::x86::FormatterInternal::formatRegister
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,RegType type,
                uint32_t id)

{
  char c;
  Error EVar1;
  VirtReg *pVVar2;
  ulong uVar3;
  uint32_t uVar4;
  VirtReg *str;
  BaseEmitter *emitter_00;
  char *pcVar5;
  FormatFlags formatFlags_00;
  FormatFlags formatFlags_01;
  ulong uVar6;
  undefined7 in_register_00000081;
  uint *puVar7;
  ulong uVar8;
  StringFormatFlags flags;
  uint uVar9;
  char cVar10;
  bool bVar11;
  
  puVar7 = (uint *)CONCAT71(in_register_00000081,type);
  uVar9 = id - 0x100;
  if (((emitter == (BaseEmitter *)0x0 || 0xfffffefe < uVar9) || (emitter->_emitterType != kCompiler)
      ) || (*(uint *)&emitter[3]._errorHandler <= uVar9)) {
    uVar6 = (ulong)type;
    if (type < 0x20) {
      if (id < (byte)x86RegFormatInfo[uVar6 * 4 + 0x83]) {
        EVar1 = String::_opString(sb,kAppend,
                                  x86RegFormatInfo +
                                  (ulong)(byte)x86RegFormatInfo[uVar6 * 4 + 0x82] + (ulong)id * 4 +
                                  0x100,0xffffffffffffffff);
        return EVar1;
      }
      if (id < (byte)x86RegFormatInfo[uVar6 * 4 + 0x80]) {
        EVar1 = String::_opFormat(sb,kAppend,
                                  x86RegFormatInfo +
                                  (ulong)(byte)x86RegFormatInfo[uVar6 * 4 + 0x81] + 0x100,(ulong)id)
        ;
        return EVar1;
      }
      if ((ulong)(byte)x86RegFormatInfo[uVar6] != 0) {
        EVar1 = String::_opFormat(sb,kAppend,"%s@%u",(ulong)(byte)x86RegFormatInfo[uVar6] + 0x156604
                                  ,(ulong)id);
        return EVar1;
      }
    }
    EVar1 = String::_opFormat(sb,kAppend,"<Reg-%u>?%u",uVar6,(ulong)id);
    return EVar1;
  }
  uVar6 = (ulong)id;
  pVVar2 = BaseCompiler::virtRegById((BaseCompiler *)emitter,id);
  if (pVVar2 == (VirtReg *)0x0) {
    formatRegister();
    uVar9 = *puVar7;
    formatFlags_00 = (FormatFlags)uVar6;
    switch(uVar9 & 7) {
    case 1:
      EVar1 = formatRegister((String *)emitter,formatFlags_00,emitter_00,kUnknown,(byte)uVar9 >> 3,
                             puVar7[1]);
      return EVar1;
    case 2:
      goto switchD_0014257f_caseD_2;
    default:
      EVar1 = String::_opString((String *)emitter,kAppend,"<None>",0xffffffffffffffff);
      return EVar1;
    case 4:
      uVar8 = *(ulong *)(puVar7 + 2);
      if (((uVar6 & 4) == 0) || (uVar8 < 10)) {
        uVar4 = 10;
        flags = kSigned;
      }
      else {
        EVar1 = String::_opString((String *)emitter,kAppend,"0x",2);
        if (EVar1 != 0) {
          return EVar1;
        }
        uVar4 = 0x10;
        flags = kNone;
      }
      EVar1 = String::_opNumber((String *)emitter,kAppend,uVar8,uVar4,0,flags);
      return EVar1;
    case 5:
      EVar1 = Formatter::formatLabel((String *)emitter,formatFlags_00,emitter_00,puVar7[1]);
      return EVar1;
    }
  }
  if (*(uint *)(pVVar2 + 0x18) < 0xc) {
    str = pVVar2 + 0x1c;
  }
  else {
    str = *(VirtReg **)(pVVar2 + 0x20);
  }
  if ((str == (VirtReg *)0x0) || (*str == (VirtReg)0x0)) {
    EVar1 = String::_opFormat(sb,kAppend,"%%%u",(ulong)uVar9);
  }
  else {
    EVar1 = String::_opString(sb,kAppend,(char *)str,0xffffffffffffffff);
  }
  if (EVar1 == 0) {
    bVar11 = true;
    if ((formatFlags & kRegType) == kNone) {
      if ((formatFlags & kRegCasts) == kNone) {
        return 0;
      }
      bVar11 = (byte)*pVVar2 >> 3 != type;
    }
    if ((((type < 0x20) && (bVar11)) && ((ulong)(byte)x86RegFormatInfo[type] != 0)) &&
       (EVar1 = String::_opFormat(sb,kAppend,"@%s",(ulong)(byte)x86RegFormatInfo[type] + 0x156604),
       EVar1 != 0)) {
      return EVar1;
    }
    return 0;
  }
  return EVar1;
switchD_0014257f_caseD_2:
  uVar9 = uVar9 >> 0x18;
  switch(uVar9) {
  case 1:
    pcVar5 = "byte ptr ";
    break;
  case 2:
    pcVar5 = "word ptr ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_00142605_caseD_3:
    pcVar5 = "";
    break;
  case 4:
    pcVar5 = "dword ptr ";
    break;
  case 6:
    pcVar5 = "fword ptr ";
    break;
  case 8:
    pcVar5 = "qword ptr ";
    break;
  case 10:
    pcVar5 = "tbyte ptr ";
    break;
  case 0x10:
    pcVar5 = "xmmword ptr ";
    break;
  default:
    if (uVar9 == 0x20) {
      pcVar5 = "ymmword ptr ";
    }
    else {
      if (uVar9 != 0x40) goto switchD_00142605_caseD_3;
      pcVar5 = "zmmword ptr ";
    }
  }
  EVar1 = String::_opString((String *)emitter,kAppend,pcVar5,0xffffffffffffffff);
  if (EVar1 != 0) {
    return EVar1;
  }
  if (((*puVar7 >> 0x12 & 7) - 1 < 6) &&
     (EVar1 = String::_opFormat((String *)emitter,kAppend,"%s:"), EVar1 != 0)) {
    return EVar1;
  }
  EVar1 = String::_opChar((String *)emitter,kAppend,'[');
  if (EVar1 != 0) {
    return EVar1;
  }
  uVar9 = *puVar7 >> 0xe & 3;
  if (uVar9 == 2) {
    pcVar5 = "rel ";
LAB_00142753:
    EVar1 = String::_opString((String *)emitter,kAppend,pcVar5,0xffffffffffffffff);
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  else if (uVar9 == 1) {
    pcVar5 = "abs ";
    goto LAB_00142753;
  }
  uVar9 = *puVar7;
  uVar8 = (ulong)uVar9;
  if ((uVar9 & 0xf8) == 0) {
    if ((uVar9 & 0x1f00) != 0) goto LAB_001427a1;
    cVar10 = '\0';
  }
  else {
    if ((uVar9 & 0xf8) == 8) {
      EVar1 = Formatter::formatLabel((String *)emitter,formatFlags_00,emitter_00,puVar7[1]);
    }
    else {
      formatFlags_01 = formatFlags_00;
      if ((uVar9 >> 0xd & 1) != 0) {
        EVar1 = String::_opString((String *)emitter,kAppend,"&",0xffffffffffffffff);
        if (EVar1 != 0) {
          return EVar1;
        }
        formatFlags_01 = formatFlags_00 & ~kRegCasts;
        uVar8 = (ulong)(byte)*puVar7;
      }
      EVar1 = formatRegister((String *)emitter,formatFlags_01,emitter_00,kUnknown,
                             (RegType)(uVar8 >> 3) & kMaxValue,puVar7[1]);
    }
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar8 = (ulong)*puVar7;
    if ((*puVar7 & 0x1f00) == 0) {
      cVar10 = '+';
    }
    else {
      EVar1 = String::_opChar((String *)emitter,kAppend,'+');
      if (EVar1 != 0) {
        return EVar1;
      }
      uVar9 = *puVar7;
LAB_001427a1:
      EVar1 = formatRegister((String *)emitter,formatFlags_00,emitter_00,kUnknown,
                             (RegType)(uVar9 >> 8) & kMaxValue,puVar7[2]);
      if (EVar1 != 0) {
        return EVar1;
      }
      uVar9 = *puVar7;
      uVar8 = (ulong)uVar9;
      cVar10 = '+';
      if ((uVar9 & 0x30000) != 0) {
        EVar1 = String::_opFormat((String *)emitter,kAppend,"*%u",
                                  (ulong)(uint)(1 << ((byte)(uVar9 >> 0x10) & 3)));
        if (EVar1 != 0) {
          return EVar1;
        }
        uVar8 = (ulong)*puVar7;
      }
    }
  }
  uVar3 = CONCAT44(puVar7[1],puVar7[3]);
  if ((uVar8 & 0xf8) != 0) {
    uVar3 = (long)(int)puVar7[3];
  }
  if (((uVar8 & 0x1ff8) != 0) && (uVar3 == 0)) {
LAB_001428b3:
    EVar1 = String::_opChar((String *)emitter,kAppend,']');
    return EVar1;
  }
  uVar8 = -uVar3;
  if (0 < (long)uVar3) {
    uVar8 = uVar3;
  }
  c = '-';
  if (-1 < (long)uVar3) {
    c = cVar10;
  }
  if ((c == '\0') || (EVar1 = String::_opChar((String *)emitter,kAppend,c), EVar1 == 0)) {
    uVar4 = 10;
    if (((uVar6 & 8) != 0) && (9 < uVar8)) {
      EVar1 = String::_opString((String *)emitter,kAppend,"0x",2);
      if (EVar1 != 0) {
        return EVar1;
      }
      uVar4 = 0x10;
    }
    EVar1 = String::_opNumber((String *)emitter,kAppend,uVar8,uVar4,0,kNone);
    if (EVar1 == 0) goto LAB_001428b3;
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(String& sb, FormatFlags formatFlags, const BaseEmitter* emitter, Arch arch, RegType type, uint32_t id) noexcept {
  DebugUtils::unused(arch);
  const RegFormatInfo& info = x86RegFormatInfo;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(id)) {
    if (emitter && emitter->emitterType() == EmitterType::kCompiler) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(id)) {
        VirtReg* vReg = cc->virtRegById(id);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(id))));

        bool formatType = (Support::test(formatFlags, FormatFlags::kRegType)) ||
                          (Support::test(formatFlags, FormatFlags::kRegCasts) && vReg->type() != type);

        if (formatType && uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
          const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
          if (typeEntry.index)
            ASMJIT_PROPAGATE(sb.appendFormat("@%s", info.typeStrings + typeEntry.index));
        }

        return kErrorOk;
      }
    }
  }
#else
  DebugUtils::unused(emitter, formatFlags);
#endif

  if (uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
    const RegFormatInfo::NameEntry& nameEntry = info.nameEntries[size_t(type)];

    if (id < nameEntry.specialCount)
      return sb.append(info.nameStrings + nameEntry.specialIndex + id * 4);

    if (id < nameEntry.count)
      return sb.appendFormat(info.nameStrings + nameEntry.formatIndex, unsigned(id));

    const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
    if (typeEntry.index)
      return sb.appendFormat("%s@%u", info.typeStrings + typeEntry.index, id);
  }

  return sb.appendFormat("<Reg-%u>?%u", uint32_t(type), id);
}